

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_write_add_filter_by_name.c
# Opt level: O2

void test_filter_by_name(char *filter_name,int filter_code,_func_int *can_filter_prog)

{
  int iVar1;
  int iVar2;
  wchar_t wVar3;
  mode_t mVar4;
  void *buff;
  archive *paVar5;
  archive_entry *entry;
  time_t tVar6;
  char *pcVar7;
  ssize_t v2;
  int64_t v2_00;
  size_t used;
  archive_entry *ae;
  
  buff = calloc(1,0x20000);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_add_filter_by_name.c"
                   ,L')',(uint)(buff != (void *)0x0),"(buff = calloc(1, buffsize)) != NULL",
                   (void *)0x0);
  if (buff == (void *)0x0) {
    return;
  }
  paVar5 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_add_filter_by_name.c"
                   ,L'.',(uint)(paVar5 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_write_set_format_ustar(paVar5);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_add_filter_by_name.c"
                      ,L'/',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_ustar(a)",paVar5);
  iVar1 = archive_write_add_filter_by_name(paVar5,filter_name);
  if (iVar1 == -0x1e) {
    pcVar7 = archive_error_string(paVar5);
    iVar2 = strcmp(pcVar7,"lzma compression not supported on this platform");
    if (iVar2 != 0) {
      pcVar7 = archive_error_string(paVar5);
      iVar2 = strcmp(pcVar7,"xz compression not supported on this platform");
      if (iVar2 != 0) goto LAB_001325d5;
    }
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_add_filter_by_name.c"
                   ,L'>');
    test_skipping("%s filter not suported on this platform",filter_name);
    iVar1 = archive_write_free(paVar5);
    wVar3 = L'?';
  }
  else {
    if (iVar1 == -0x14) {
      iVar1 = (*can_filter_prog)();
      if (iVar1 == 0) {
        skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_add_filter_by_name.c"
                       ,L'3');
        test_skipping("%s filter not suported on this platform",filter_name);
        iVar1 = archive_write_free(paVar5);
        wVar3 = L'5';
        goto LAB_00132bc7;
      }
      goto LAB_00132603;
    }
LAB_001325d5:
    wVar3 = assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_add_filter_by_name.c"
                                ,L'C',0,"ARCHIVE_OK",(long)iVar1,"r",paVar5);
    if (wVar3 != L'\0') {
LAB_00132603:
      if (filter_code == 10) {
        iVar1 = archive_write_set_options(paVar5,"lrzip:compression=none");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_add_filter_by_name.c"
                            ,L'Q',0,"ARCHIVE_OK",(long)iVar1,
                            "archive_write_set_options(a, \"lrzip:compression=none\")",paVar5);
      }
      iVar1 = archive_write_set_bytes_per_block(paVar5,10);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_add_filter_by_name.c"
                          ,L'S',0,"ARCHIVE_OK",(long)iVar1,
                          "archive_write_set_bytes_per_block(a, 10)",paVar5);
      iVar1 = archive_write_open_memory(paVar5,buff,0x20000,&used);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_add_filter_by_name.c"
                          ,L'U',0,"ARCHIVE_OK",(long)iVar1,
                          "archive_write_open_memory(a, buff, buffsize, &used)",paVar5);
      entry = archive_entry_new();
      ae = entry;
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_add_filter_by_name.c"
                       ,L'Z',(uint)(entry != (archive_entry *)0x0),
                       "(ae = archive_entry_new()) != NULL",(void *)0x0);
      archive_entry_set_mtime(entry,1,0);
      tVar6 = archive_entry_mtime(entry);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_add_filter_by_name.c"
                          ,L'\\',1,"1",tVar6,"archive_entry_mtime(ae)",(void *)0x0);
      archive_entry_set_ctime(entry,1,0);
      tVar6 = archive_entry_ctime(entry);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_add_filter_by_name.c"
                          ,L'^',1,"1",tVar6,"archive_entry_ctime(ae)",(void *)0x0);
      archive_entry_set_atime(entry,1,0);
      tVar6 = archive_entry_atime(entry);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_add_filter_by_name.c"
                          ,L'`',1,"1",tVar6,"archive_entry_atime(ae)",(void *)0x0);
      archive_entry_copy_pathname(entry,"file");
      pcVar7 = archive_entry_pathname(entry);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_add_filter_by_name.c"
                 ,L'b',"file","\"file\"",pcVar7,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
      archive_entry_set_mode(entry,0x81ed);
      mVar4 = archive_entry_mode(entry);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_add_filter_by_name.c"
                          ,L'd',0x81ed,"(AE_IFREG | 0755)",(ulong)mVar4,"archive_entry_mode(ae)",
                          (void *)0x0);
      archive_entry_set_size(entry,8);
      iVar1 = archive_write_header(paVar5,entry);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_add_filter_by_name.c"
                          ,L'f',0,"0",(long)iVar1,"archive_write_header(a, ae)",(void *)0x0);
      archive_entry_free(entry);
      v2 = archive_write_data(paVar5,"12345678",8);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_add_filter_by_name.c"
                          ,L'h',8,"8",v2,"archive_write_data(a, \"12345678\", 8)",(void *)0x0);
      iVar1 = archive_write_close(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_add_filter_by_name.c"
                          ,L'k',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",paVar5);
      iVar1 = archive_write_free(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_add_filter_by_name.c"
                          ,L'l',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
      paVar5 = archive_read_new();
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_add_filter_by_name.c"
                       ,L'q',(uint)(paVar5 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                       (void *)0x0);
      iVar1 = archive_read_support_format_all(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_add_filter_by_name.c"
                          ,L'r',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",
                          paVar5);
      iVar1 = archive_read_support_filter_all(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_add_filter_by_name.c"
                          ,L's',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",
                          paVar5);
      iVar1 = archive_read_open_memory(paVar5,buff,used);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_add_filter_by_name.c"
                          ,L't',0,"ARCHIVE_OK",(long)iVar1,"archive_read_open_memory(a, buff, used)"
                          ,paVar5);
      iVar1 = archive_read_next_header(paVar5,&ae);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_add_filter_by_name.c"
                          ,L'y',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar5
                         );
      tVar6 = archive_entry_mtime(ae);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_add_filter_by_name.c"
                          ,L'z',1,"1",tVar6,"archive_entry_mtime(ae)",(void *)0x0);
      pcVar7 = archive_entry_pathname(ae);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_add_filter_by_name.c"
                 ,L'{',"file","\"file\"",pcVar7,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
      mVar4 = archive_entry_filetype(ae);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_add_filter_by_name.c"
                          ,L'|',0x8000,"AE_IFREG",(ulong)mVar4,"archive_entry_filetype(ae)",
                          (void *)0x0);
      v2_00 = archive_entry_size(ae);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_add_filter_by_name.c"
                          ,L'}',8,"8",v2_00,"archive_entry_size(ae)",(void *)0x0);
      iVar1 = archive_read_next_header(paVar5,&ae);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_add_filter_by_name.c"
                          ,L'\x80',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",
                          paVar5);
      iVar1 = archive_filter_code(paVar5,0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_add_filter_by_name.c"
                          ,L'\x83',(ulong)(uint)filter_code,"filter_code",(long)iVar1,
                          "archive_filter_code(a, 0)",paVar5);
      iVar1 = archive_format(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_add_filter_by_name.c"
                          ,L'\x84',0x30001,"ARCHIVE_FORMAT_TAR_USTAR",(long)iVar1,
                          "archive_format(a)",paVar5);
      iVar1 = archive_read_close(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_add_filter_by_name.c"
                          ,L'\x86',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
      iVar1 = archive_read_free(paVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_add_filter_by_name.c"
                          ,L'\x87',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
      free(buff);
      return;
    }
    iVar1 = archive_write_free(paVar5);
    wVar3 = L'D';
  }
LAB_00132bc7:
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_write_add_filter_by_name.c"
                      ,wVar3,0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  free(buff);
  return;
}

Assistant:

static void
test_filter_by_name(const char *filter_name, int filter_code,
    int (*can_filter_prog)(void))
{
	struct archive_entry *ae;
	struct archive *a;
	size_t used;
	size_t buffsize = 1024 * 128;
	char *buff;
	int r;

	assert((buff = calloc(1, buffsize)) != NULL);
	if (buff == NULL)
		return;

	/* Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	r = archive_write_add_filter_by_name(a, filter_name);
	if (r == ARCHIVE_WARN) {
		if (!can_filter_prog()) {
			skipping("%s filter not suported on this platform",
			    filter_name);
			assertEqualInt(ARCHIVE_OK, archive_write_free(a));
			free(buff);
			return;
		}
	} else if (r == ARCHIVE_FATAL &&
	    (strcmp(archive_error_string(a),
		   "lzma compression not supported on this platform") == 0 ||
	     strcmp(archive_error_string(a),
		   "xz compression not supported on this platform") == 0)) {
		skipping("%s filter not suported on this platform", filter_name);
		assertEqualInt(ARCHIVE_OK, archive_write_free(a));
		free(buff);
		return;
	} else {
		if (!assertEqualIntA(a, ARCHIVE_OK, r)) {
			assertEqualInt(ARCHIVE_OK, archive_write_free(a));
			free(buff);
			return;
		}
	}
	if (filter_code == ARCHIVE_FILTER_LRZIP)
	{
		/*
		 * There's a bug in lrzip (as of release 0.612) where 2nd stage
		 * compression can't be performed on smaller files. Set lrzip to
		 * use no 2nd stage compression.
		 */
		assertEqualIntA(a, ARCHIVE_OK,
			archive_write_set_options(a, "lrzip:compression=none"));
	}
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_bytes_per_block(a, 10));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_open_memory(a, buff, buffsize, &used));

	/*
	 * Write a file to it.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_mtime(ae, 1, 0);
	assertEqualInt(1, archive_entry_mtime(ae));
	archive_entry_set_ctime(ae, 1, 0);
	assertEqualInt(1, archive_entry_ctime(ae));
	archive_entry_set_atime(ae, 1, 0);
	assertEqualInt(1, archive_entry_atime(ae));
	archive_entry_copy_pathname(ae, "file");
	assertEqualString("file", archive_entry_pathname(ae));
	archive_entry_set_mode(ae, AE_IFREG | 0755);
	assertEqualInt((AE_IFREG | 0755), archive_entry_mode(ae));
	archive_entry_set_size(ae, 8);
	assertEqualInt(0, archive_write_header(a, ae));
	archive_entry_free(ae);
	assertEqualInt(8, archive_write_data(a, "12345678", 8));

	/* Close out the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/*
	 * Now, read the data back.
	 */
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_open_memory(a, buff, used));

	/*
	 * Read and verify the file.
	 */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(1, archive_entry_mtime(ae));
	assertEqualString("file", archive_entry_pathname(ae));
	assertEqualInt(AE_IFREG, archive_entry_filetype(ae));
	assertEqualInt(8, archive_entry_size(ae));

	/* Verify the end of the archive. */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));

	/* Verify archive format. */
	assertEqualIntA(a, filter_code, archive_filter_code(a, 0));
	assertEqualIntA(a, ARCHIVE_FORMAT_TAR_USTAR, archive_format(a));

	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
	free(buff);
}